

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteScript(BinaryWriterSpec *this,Script *script)

{
  Var *this_00;
  pointer puVar1;
  unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> base;
  string_view s;
  string_view text;
  string_view s_00;
  string_view s_01;
  string_view filename;
  ModuleCommand *pMVar2;
  AssertTrapCommandBase<(wabt::CommandType)8> *pAVar3;
  RegisterCommand *pRVar4;
  AssertReturnCommand *pAVar5;
  ActionCommandBase<(wabt::CommandType)1> *pAVar6;
  AssertModuleCommand<(wabt::CommandType)3> *pAVar7;
  char *pcVar8;
  int __c;
  size_type extraout_RDX;
  Var *__s;
  Action *action;
  ulong uVar9;
  string_view filename_00;
  string_view sVar10;
  int local_54;
  string local_50;
  
  this->script_ = script;
  Stream::Writef(this->json_stream_,"{\"source_filename\": ");
  sVar10.data_ = (this->source_filename_)._M_dataplus._M_p;
  sVar10.size_ = (this->source_filename_)._M_string_length;
  WriteEscapedString(this,sVar10);
  Stream::Writef(this->json_stream_,",\n \"commands\": [\n");
  local_54 = -1;
  uVar9 = 0;
  do {
    puVar1 = (this->script_->commands).
             super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->script_->commands).
                      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar9) {
      Stream::Writef(this->json_stream_,"]}\n");
      return (Result)(this->result_).enum_;
    }
    base._M_t.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = puVar1[uVar9]._M_t;
    if (uVar9 != 0) {
      WriteSeparator(this);
      Stream::Writef(this->json_stream_,"\n");
    }
    Stream::Writef(this->json_stream_,"  {");
    WriteKey(this,"type");
    WriteString(this,_ZZN4wabt12_GLOBAL__N_116BinaryWriterSpec16WriteCommandTypeERKNS_7CommandEE15s_command_names_rel
                     + *(int *)(
                               _ZZN4wabt12_GLOBAL__N_116BinaryWriterSpec16WriteCommandTypeERKNS_7CommandEE15s_command_names_rel
                               + (long)(int)*(CommandType *)
                                             ((long)base._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                                                  .super__Head_base<0UL,_wabt::Command_*,_false>.
                                                  _M_head_impl + 8) * 4));
    WriteSeparator(this);
    switch(*(CommandType *)
            ((long)base._M_t.
                   super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                   super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                   super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl + 8)) {
    case First:
      pMVar2 = cast<wabt::ModuleCommand,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
                (&local_50,this,kWasmExtension);
      WriteLocation(this,&(pMVar2->module).loc);
      WriteSeparator(this);
      if ((pMVar2->module).name._M_string_length != 0) {
        WriteKey(this,"name");
        s.data_ = (pMVar2->module).name._M_dataplus._M_p;
        s.size_ = (pMVar2->module).name._M_string_length;
        WriteEscapedString(this,s);
        WriteSeparator(this);
      }
      WriteKey(this,"filename");
      filename_00.size_ = extraout_RDX;
      filename_00.data_ = (char *)local_50._M_string_length;
      sVar10 = GetBasename((wabt *)local_50._M_dataplus._M_p,filename_00);
      WriteEscapedString(this,sVar10);
      filename.size_ = local_50._M_string_length;
      filename.data_ = local_50._M_dataplus._M_p;
      WriteModule(this,filename,&pMVar2->module);
      this->num_modules_ = this->num_modules_ + 1;
      std::__cxx11::string::_M_dispose();
      local_54 = (int)uVar9;
      break;
    case Action:
      pAVar6 = cast<wabt::ActionCommandBase<(wabt::CommandType)1>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      action = (pAVar6->action)._M_t.
               super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
               super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
      WriteLocation(this,&action->loc);
      WriteSeparator(this);
      WriteAction(this,action);
      WriteSeparator(this);
      WriteKey(this,"expected");
      goto LAB_0013c450;
    case Register:
      pRVar4 = cast<wabt::RegisterCommand,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      this_00 = &pRVar4->var;
      __s = this_00;
      WriteLocation(this,&this_00->loc);
      WriteSeparator(this);
      if ((pRVar4->var).type_ == Name) {
        WriteKey(this,"name");
        WriteVar(this,this_00);
        WriteSeparator(this);
      }
      else {
        pcVar8 = Var::index(this_00,(char *)__s,__c);
        if ((int)pcVar8 != local_54) {
          __assert_fail("var.index() == last_module_index",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer-spec.cc"
                        ,0x1f6,"void wabt::(anonymous namespace)::BinaryWriterSpec::WriteCommands()"
                       );
        }
      }
      WriteKey(this,"as");
      s_01.data_ = (pRVar4->module_name)._M_dataplus._M_p;
      s_01.size_ = (pRVar4->module_name)._M_string_length;
      WriteEscapedString(this,s_01);
      break;
    case AssertMalformed:
      pAVar7 = cast<wabt::AssertModuleCommand<(wabt::CommandType)3>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_0013c3bc;
    case AssertInvalid:
      pAVar7 = (AssertModuleCommand<(wabt::CommandType)3> *)
               cast<wabt::AssertModuleCommand<(wabt::CommandType)4>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_0013c3bc;
    case AssertUnlinkable:
      pAVar7 = (AssertModuleCommand<(wabt::CommandType)3> *)
               cast<wabt::AssertModuleCommand<(wabt::CommandType)5>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_0013c3bc;
    case AssertUninstantiable:
      pAVar7 = (AssertModuleCommand<(wabt::CommandType)3> *)
               cast<wabt::AssertModuleCommand<(wabt::CommandType)6>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
LAB_0013c3bc:
      text.data_ = (pAVar7->text)._M_dataplus._M_p;
      text.size_ = (pAVar7->text)._M_string_length;
      WriteInvalidModule(this,(pAVar7->module)._M_t.
                              super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                              .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl,text)
      ;
      this->num_modules_ = this->num_modules_ + 1;
      break;
    case AssertReturn:
      pAVar5 = cast<wabt::AssertReturnCommand,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      WriteLocation(this,&((pAVar5->action)._M_t.
                           super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>
                           .super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl)->loc);
      WriteSeparator(this);
      WriteAction(this,(pAVar5->action)._M_t.
                       super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                       super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl);
      WriteSeparator(this);
      WriteKey(this,"expected");
      WriteConstVector(this,&pAVar5->expected);
      break;
    case AssertTrap:
      pAVar3 = cast<wabt::AssertTrapCommandBase<(wabt::CommandType)8>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_0013c3e4;
    case AssertExhaustion:
      pAVar3 = (AssertTrapCommandBase<(wabt::CommandType)8> *)
               cast<wabt::AssertTrapCommandBase<(wabt::CommandType)9>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
LAB_0013c3e4:
      WriteLocation(this,&((pAVar3->action)._M_t.
                           super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>
                           .super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl)->loc);
      WriteSeparator(this);
      WriteAction(this,(pAVar3->action)._M_t.
                       super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                       super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl);
      WriteSeparator(this);
      WriteKey(this,"text");
      s_00.data_ = (pAVar3->text)._M_dataplus._M_p;
      s_00.size_ = (pAVar3->text)._M_string_length;
      WriteEscapedString(this,s_00);
      WriteSeparator(this);
      WriteKey(this,"expected");
      action = (pAVar3->action)._M_t.
               super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
               super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
LAB_0013c450:
      WriteActionResultType(this,action);
    }
    Stream::Writef(this->json_stream_,"}");
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

Result BinaryWriterSpec::WriteScript(const Script& script) {
  script_ = &script;
  WriteCommands();
  return result_;
}